

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O0

int8_t msocket_send_to(msocket_t *self,char *addr,uint16_t port,void *msgData,uint32_t msgLen)

{
  ssize_t sVar1;
  int *piVar2;
  int local_64;
  undefined1 local_60 [4];
  int rc;
  sockaddr_in6 saddr6;
  sockaddr_in saddr;
  uint32_t msgLen_local;
  void *msgData_local;
  uint16_t port_local;
  char *addr_local;
  msocket_t *self_local;
  
  if ((self == (msocket_t *)0x0) || ((self->socketMode & 1) == 0)) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    self_local._7_1_ = -1;
  }
  else {
    if (self->addressFamily == '\n') {
      memset(local_60,0,0x1c);
      local_60._0_2_ = 10;
      local_60._2_2_ = htons(port);
      inet_pton(10,addr,&saddr6);
      sVar1 = sendto(self->udpsockfd,msgData,(ulong)msgLen,0,(sockaddr *)local_60,0x1c);
      local_64 = (int)sVar1;
    }
    else {
      memset((void *)((long)&saddr6.sin6_addr.__in6_u + 0xc),0,0x10);
      saddr6.sin6_addr.__in6_u.__u6_addr16[6] = 2;
      saddr6.sin6_addr.__in6_u.__u6_addr16[7] = htons(port);
      inet_pton(2,addr,&saddr6.sin6_scope_id);
      sVar1 = sendto(self->udpsockfd,msgData,(ulong)msgLen,0,
                     (sockaddr *)((long)&saddr6.sin6_addr.__in6_u + 0xc),0x10);
      local_64 = (int)sVar1;
    }
    if (local_64 < 0) {
      self_local._7_1_ = -1;
    }
    else {
      pthread_mutex_lock((pthread_mutex_t *)&self->mutex);
      msocket_timeoutReset(self);
      pthread_mutex_unlock((pthread_mutex_t *)&self->mutex);
      self_local._7_1_ = '\0';
    }
  }
  return self_local._7_1_;
}

Assistant:

int8_t msocket_send_to(msocket_t *self, const char *addr,uint16_t port,const void *msgData,uint32_t msgLen){
   if( (self != 0) && ( (self->socketMode & MSOCKET_MODE_UDP) != 0)){
      struct sockaddr_in saddr;
      struct sockaddr_in6 saddr6;
      int rc;
      if(self->addressFamily == AF_INET6){
         memset(&saddr6, 0,sizeof(saddr6));
         saddr6.sin6_family = AF_INET6;
         saddr6.sin6_port = htons((uint16_t)port);
         inet_pton(AF_INET6, addr, &(saddr6.sin6_addr));
         rc = sendto(self->udpsockfd,msgData,msgLen,0,(struct sockaddr *)&saddr6,sizeof(saddr6));
      }
      else{
         memset(&saddr, 0,sizeof(saddr));
         saddr.sin_family = AF_INET;
         saddr.sin_port = htons((uint16_t)port);
         inet_pton(AF_INET, addr, &(saddr.sin_addr));
         rc = sendto(self->udpsockfd,msgData,msgLen,0,(struct sockaddr *)&saddr,sizeof(saddr));
      }
      if(rc < 0){
         return -1;
      }
      MUTEX_LOCK(self->mutex);
      msocket_timeoutReset(self);
      MUTEX_UNLOCK(self->mutex);
      return 0;
   }
   errno = EINVAL;
   return -1;
}